

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NodePrintKMap(Abc_Obj_t *pNode,int fUseRealNames)

{
  Vec_Ptr_t *vNames;
  
  if (fUseRealNames != 0) {
    vNames = Abc_NodeGetFaninNames(pNode);
    Extra_PrintKMap(_stdout,(DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData,
                    (DdNode *)((ulong)(pNode->field_5).pData ^ 1),(pNode->vFanins).nSize,
                    (DdNode **)0x0,0,(char **)vNames->pArray);
    Abc_NodeFreeNames(vNames);
    return;
  }
  Extra_PrintKMap(_stdout,(DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData,
                  (DdNode *)((ulong)(pNode->field_5).pData ^ 1),(pNode->vFanins).nSize,
                  (DdNode **)0x0,0,(char **)0x0);
  return;
}

Assistant:

void Abc_NodePrintKMap( Abc_Obj_t * pNode, int fUseRealNames )
{
#ifdef ABC_USE_CUDD
    Vec_Ptr_t * vNamesIn;
    if ( fUseRealNames )
    {
        vNamesIn = Abc_NodeGetFaninNames(pNode);
        Extra_PrintKMap( stdout, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, Cudd_Not(pNode->pData),
            Abc_ObjFaninNum(pNode), NULL, 0, (char **)vNamesIn->pArray );
        Abc_NodeFreeNames( vNamesIn );
    }
    else
        Extra_PrintKMap( stdout, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, Cudd_Not(pNode->pData),
            Abc_ObjFaninNum(pNode), NULL, 0, NULL );
#endif
}